

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O3

longdouble * __thiscall
TPZFMatrix<long_double>::operator()
          (longdouble *__return_storage_ptr__,TPZFMatrix<long_double> *this,int64_t row,int64_t col)

{
  if (((-1 < (long)this && (long)this < *(long *)((long)__return_storage_ptr__ + 8)) && (-1 < row))
     && (row < *(long *)(__return_storage_ptr__ + 1))) {
    return (longdouble *)
           (*(long *)((long)__return_storage_ptr__ + 8) * row * 0x10 +
           *(long *)(__return_storage_ptr__ + 2));
  }
  Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x278);
}

Assistant:

inline TVar TPZFMatrix<TVar>::operator()( const int64_t row, const int64_t col) const {
#ifndef PZNODEBUG
    if(row >=  this->Rows() || row<0 || col >=  this->Cols() || col<0) {
        Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        DebugStop();
    }
#endif
    return *(this->fElem+col*this->fRow+row);
}